

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonparser.cpp
# Opt level: O1

QCborValue * __thiscall
QJsonPrivate::Parser::parseNumber(QCborValue *__return_storage_ptr__,Parser *this)

{
  byte *pbVar1;
  byte *pbVar2;
  long lVar3;
  bool bVar4;
  byte *pbVar5;
  long in_FS_OFFSET;
  double dVar6;
  bool ok;
  bool local_39;
  QByteArray local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.ptr = this->json;
  pbVar2 = (byte *)this->end;
  if ((local_38.d.ptr < pbVar2) && (*local_38.d.ptr == 0x2d)) {
    this->json = (char *)((byte *)local_38.d.ptr + 1);
  }
  pbVar5 = (byte *)this->json;
  if ((pbVar5 < pbVar2) && (*pbVar5 == 0x30)) {
    this->json = (char *)(pbVar5 + 1);
  }
  else {
    pbVar5 = (byte *)this->json;
    if (pbVar5 < pbVar2) {
      do {
        if (9 < (int)(char)*pbVar5 - 0x30U) break;
        pbVar5 = pbVar5 + 1;
        this->json = (char *)pbVar5;
      } while (pbVar5 != pbVar2);
    }
  }
  pbVar5 = (byte *)this->json;
  bVar4 = true;
  if ((pbVar5 < pbVar2) && (*pbVar5 == 0x2e)) {
    pbVar5 = pbVar5 + 1;
    this->json = (char *)pbVar5;
    if (pbVar5 < pbVar2) {
      bVar4 = true;
      do {
        if (9 < (int)(char)*pbVar5 - 0x30U) break;
        bVar4 = (bool)(bVar4 & *pbVar5 == 0x30);
        pbVar5 = pbVar5 + 1;
        this->json = (char *)pbVar5;
      } while (pbVar5 != pbVar2);
    }
  }
  pbVar5 = (byte *)this->json;
  if ((pbVar5 < pbVar2) && ((*pbVar5 | 0x20) == 0x65)) {
    pbVar1 = pbVar5 + 1;
    this->json = (char *)pbVar1;
    if ((pbVar1 < pbVar2) && ((*pbVar1 == 0x2d || (*pbVar1 == 0x2b)))) {
      this->json = (char *)(pbVar5 + 2);
    }
    pbVar5 = (byte *)this->json;
    if (pbVar5 < pbVar2) {
      do {
        if (9 < (int)(char)*pbVar5 - 0x30U) break;
        pbVar5 = pbVar5 + 1;
        this->json = (char *)pbVar5;
      } while (pbVar5 != pbVar2);
    }
    bVar4 = false;
  }
  local_38.d.size = (long)this->json - (long)local_38.d.ptr;
  local_38.d.d = (Data *)0x0;
  if (bVar4) {
    local_39 = true;
    lVar3 = QByteArray::toLongLong(&local_38,&local_39,10);
    if (local_39 != true) goto LAB_001174ed;
  }
  else {
LAB_001174ed:
    local_39 = true;
    dVar6 = QByteArray::toDouble(&local_38,&local_39);
    if (local_39 == false) {
      this->lastError = IllegalNumber;
      __return_storage_ptr__->n = 0;
      __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
      __return_storage_ptr__->t = Undefined;
      goto LAB_00117595;
    }
    lVar3 = (long)dVar6;
    if ((lVar3 == -0x8000000000000000) && (dVar6 != -9.223372036854776e+18)) {
      bVar4 = false;
      if (0.0 < dVar6) {
        lVar3 = 0x7fffffffffffffff;
      }
    }
    else {
      bVar4 = dVar6 == (double)lVar3;
    }
    if (!bVar4) {
      __return_storage_ptr__->n = 0;
      __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
      __return_storage_ptr__->t = Double;
      __return_storage_ptr__->n = (qint64)dVar6;
      goto LAB_00117595;
    }
  }
  __return_storage_ptr__->n = lVar3;
  __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
  __return_storage_ptr__->t = Integer;
LAB_00117595:
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QCborValue Parser::parseNumber()
{
    const char *start = json;
    bool isInt = true;

    // minus
    if (json < end && *json == '-')
        ++json;

    // int = zero / ( digit1-9 *DIGIT )
    if (json < end && *json == '0') {
        ++json;
    } else {
        while (json < end && isAsciiDigit(*json))
            ++json;
    }

    // frac = decimal-point 1*DIGIT
    if (json < end && *json == '.') {
        ++json;
        while (json < end && isAsciiDigit(*json)) {
            isInt = isInt && *json == '0';
            ++json;
        }
    }

    // exp = e [ minus / plus ] 1*DIGIT
    if (json < end && (*json == 'e' || *json == 'E')) {
        isInt = false;
        ++json;
        if (json < end && (*json == '-' || *json == '+'))
            ++json;
        while (json < end && isAsciiDigit(*json))
            ++json;
    }

    const QByteArray number = QByteArray::fromRawData(start, json - start);

    if (isInt) {
        bool ok;
        qlonglong n = number.toLongLong(&ok);
        if (ok) {
            return QCborValue(n);
        }
    }

    bool ok;
    double d = number.toDouble(&ok);

    if (!ok) {
        lastError = QJsonParseError::IllegalNumber;
        return QCborValue();
    }

    qint64 n;
    if (convertDoubleTo(d, &n))
        return QCborValue(n);
    return QCborValue(d);
}